

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O0

void __thiscall
pass_check_d_flip_flop_Test::~pass_check_d_flip_flop_Test(pass_check_d_flip_flop_Test *this)

{
  pass_check_d_flip_flop_Test *this_local;
  
  ~pass_check_d_flip_flop_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(pass, check_d_flip_flop) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    auto seq = mod.sequential();
    seq->add_stmt(a.assign(constant(1, 1)));
    auto if_ = std::make_shared<IfStmt>(a);
    seq->add_stmt(if_);
    if_->add_then_stmt(b.assign(constant(1, 1)));

    EXPECT_THROW(check_flip_flop_always_ff(&mod), StmtException);
}